

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_insertADynArray_success_endIndex_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  void *_ck_x;
  char **ppcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  private_ACUtilsTest_ADynArray_CharArray destArray;
  
  destArray.buffer = (char *)0x0;
  destArray.reallocator._0_4_ = 0x10a480;
  destArray.reallocator._4_4_ = 0;
  destArray.deallocator._0_4_ = 0x10a4c0;
  destArray.deallocator._4_4_ = 0;
  destArray.size = 5;
  destArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
  destArray.capacity = 8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_50 = 0x11240b;
  destArray.buffer = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  builtin_strncpy(destArray.buffer,"01234",5);
  uStack_50 = 0x112425;
  pcVar3 = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  pcVar3[0] = '5';
  pcVar3[1] = '6';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  uStack_50 = 0x112454;
  bVar1 = private_ACUtils_ADynArray_insertArray(&destArray,5,pcVar3,3,1);
  if (bVar1 == true) {
    uStack_50 = 0x11246e;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x401);
    if (destArray.size == 8) {
      uStack_50 = 0x11248e;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x402);
      if (destArray.capacity == 8) {
        uStack_50 = 0x1124ae;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x403);
        if (destArray.buffer == (char *)0x0) {
          ppcVar7 = &local_58;
          pcVar5 = "Assertion \'_ck_x != NULL\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %#x";
          pcVar8 = "(void*) destArray.buffer != NULL";
          pcVar9 = "(void*) destArray.buffer";
          iVar2 = 0x404;
          goto LAB_001127d2;
        }
        uStack_50 = 0x1124cb;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x404);
        pcStack_80 = destArray.buffer;
        if (destArray.buffer == (char *)0x0) {
          pcVar5 = "";
          pcStack_80 = "(null)";
        }
        else {
          uStack_50 = 0x1124e8;
          iVar2 = strcmp("0123456",destArray.buffer);
          if (iVar2 == 0) {
            uStack_50 = 0x112501;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x405);
            if (destArray.growStrategy == (ACUtilsGrowStrategy)0x0) {
              ppcVar7 = &local_58;
              pcVar5 = "Assertion \'_ck_x != NULL\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
              pcVar8 = "(void*) destArray.growStrategy != NULL";
              pcVar9 = "(void*) destArray.growStrategy";
              iVar2 = 0x406;
LAB_001127d2:
              uStack_50 = 0;
              local_58 = (char *)0x0;
              *(code **)((long)ppcVar7 + -8) =
                   test_ADynArray_insertADynArray_success_beyondEndIndex_fn;
              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                                ,iVar2,pcVar5,pcVar3,pcVar8,pcVar9);
            }
            uStack_50 = 0x112521;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x406);
            uStack_50 = 0x11252e;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x407);
            uStack_50 = 0x11253b;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x408);
            uStack_50 = 0x112548;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x409);
            uStack_50 = 0x11255a;
            iVar2 = strcmp("56",pcVar3);
            if (iVar2 == 0) {
              uStack_50 = 0x112576;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x40a);
              uStack_50 = 0x112583;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x40b);
              if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
                uStack_50 = 0x1125a4;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x40c);
                uStack_50 = 0x1125ad;
                (*(code *)CONCAT44(destArray.deallocator._4_4_,destArray.deallocator._0_4_))
                          (destArray.buffer);
                private_ACUtilsTest_ADynArray_freeCount =
                     private_ACUtilsTest_ADynArray_freeCount + 1;
                uStack_50 = 0x1125bc;
                free(pcVar3);
                return;
              }
              ppcVar7 = &local_68;
              local_60 = "0";
              local_68 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
              pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
              pcVar8 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
              pcVar9 = "private_ACUtilsTest_ADynArray_reallocCount";
              iVar2 = 0x40c;
              goto LAB_001127d2;
            }
            pcVar5 = "\"";
            expr = 
            "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
            ;
            pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
            pcVar8 = "srcArray.buffer == \"56\"";
            pcVar9 = "srcArray.buffer";
            iVar2 = 0x40a;
            local_58 = "\"";
            local_60 = "56";
            local_68 = "\"";
            pcStack_70 = "\"56\"";
            pcStack_78 = "\"";
            ppcVar6 = &pcStack_80;
            pcStack_80 = pcVar3;
            goto LAB_00112787;
          }
          pcVar5 = "\"";
        }
        expr = 
        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
        ;
        pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
        pcVar8 = "destArray.buffer == \"0123456\"";
        pcVar9 = "destArray.buffer";
        iVar2 = 0x405;
        local_58 = "\"";
        local_60 = "0123456";
        local_68 = "\"";
        pcStack_70 = "\"0123456\"";
        ppcVar6 = &pcStack_80;
        pcStack_78 = pcVar5;
        goto LAB_00112787;
      }
      pcVar8 = "destArray.capacity == 8";
      pcVar9 = "destArray.capacity";
      iVar2 = 0x403;
      pcVar5 = (char *)destArray.capacity;
    }
    else {
      pcVar8 = "destArray.size == 8";
      pcVar9 = "destArray.size";
      iVar2 = 0x402;
      pcVar5 = (char *)destArray.size;
    }
    local_60 = "8";
    local_58 = (char *)0x8;
  }
  else {
    pcVar5 = (char *)(ulong)bVar1;
    local_60 = "true";
    pcVar8 = 
    "(&srcArray == ((void*)0) ? &destArray != ((void*)0) : private_ACUtils_ADynArray_insertArray(&destArray, 5, (&srcArray)->buffer, (&srcArray)->size, sizeof(*(&destArray)->buffer))) == true"
    ;
    pcVar9 = 
    "(&srcArray == ((void*)0) ? &destArray != ((void*)0) : private_ACUtils_ADynArray_insertArray(&destArray, 5, (&srcArray)->buffer, (&srcArray)->size, sizeof(*(&destArray)->buffer)))"
    ;
    iVar2 = 0x401;
    local_58 = (char *)0x1;
  }
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  ppcVar6 = &local_60;
LAB_00112787:
  uStack_50 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar5;
  *(undefined8 *)((long)ppcVar6 + -0x10) = 0x11278e;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar4,pcVar8,pcVar9);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_insertADynArray_success_endIndex)
{
    struct private_ACUtilsTest_ADynArray_CharArray destArray = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    struct private_ACUtilsTest_ADynArray_CharArray srcArray = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    destArray.size = 5;
    destArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    destArray.capacity = 8;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    destArray.buffer = (char*) destArray.reallocator(nullptr, destArray.capacity);
    memcpy(destArray.buffer, "01234", 5);
    srcArray.size = 3;
    srcArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    srcArray.capacity = 8;
    srcArray.buffer = (char*) srcArray.reallocator(nullptr, srcArray.capacity);
    memcpy(srcArray.buffer, "56\0", 4);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_insertADynArray(&destArray, 5, &srcArray), true);
    ACUTILSTEST_ASSERT_UINT_EQ(destArray.size, 8);
    ACUTILSTEST_ASSERT_UINT_EQ(destArray.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(destArray.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(destArray.buffer, "0123456");
    ACUTILSTEST_ASSERT_PTR_NONNULL(destArray.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(srcArray.size, 3);
    ACUTILSTEST_ASSERT_UINT_EQ(srcArray.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(srcArray.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(srcArray.buffer, "56");
    ACUTILSTEST_ASSERT_PTR_NONNULL(srcArray.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    destArray.deallocator(destArray.buffer);
    srcArray.deallocator(srcArray.buffer);
}